

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

void __thiscall HighsMipSolverData::setupDomainPropagation(HighsMipSolverData *this)

{
  int iVar1;
  int iVar2;
  HighsLp *pHVar3;
  pointer pdVar4;
  pointer piVar5;
  HighsMipSolver *mipsolver;
  pointer pdVar6;
  double dVar7;
  ulong uVar8;
  long lVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  double *pdVar11;
  ulong uVar12;
  byte bVar13;
  double dVar14;
  HighsDomain local_358;
  
  bVar13 = 0;
  pHVar3 = this->mipsolver->model_;
  highsSparseTranspose
            (pHVar3->num_row_,pHVar3->num_col_,&(pHVar3->a_matrix_).start_,
             &(pHVar3->a_matrix_).index_,&(pHVar3->a_matrix_).value_,&this->ARstart_,&this->ARindex_
             ,&this->ARvalue_);
  HighsPseudocost::HighsPseudocost((HighsPseudocost *)&local_358,this->mipsolver);
  pdVar4 = (this->pseudocost).pseudocostup.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).pseudocostup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_358.changedcolsflags_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->pseudocost).pseudocostup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_358.changedcolsflags_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (this->pseudocost).pseudocostup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_358.changedcolsflags_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_358.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4);
  }
  pdVar4 = (this->pseudocost).pseudocostdown.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).pseudocostdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_358.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->pseudocost).pseudocostdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_358.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (this->pseudocost).pseudocostdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_358.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_358.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4);
  }
  piVar5 = (this->pseudocost).nsamplesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).nsamplesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_358.propRowNumChangedBounds_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start)->first;
  (this->pseudocost).nsamplesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_358.propRowNumChangedBounds_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->first;
  (this->pseudocost).nsamplesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_358.propRowNumChangedBounds_.
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage)->first;
  local_358.propRowNumChangedBounds_.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.propRowNumChangedBounds_.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.propRowNumChangedBounds_.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  piVar5 = (this->pseudocost).nsamplesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).nsamplesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_358.domchgstack_.
                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->pseudocost).nsamplesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_358.domchgstack_.
                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (this->pseudocost).nsamplesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_358.domchgstack_.
                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_358.domchgstack_.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.domchgstack_.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.domchgstack_.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  pdVar4 = (this->pseudocost).inferencesup.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).inferencesup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_358.domchgreason_.
                super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).inferencesup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_358.domchgreason_.
                super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (this->pseudocost).inferencesup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_358.domchgreason_.
                super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_358.domchgreason_.
  super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.domchgreason_.
  super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.domchgreason_.
  super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4);
  }
  pdVar4 = (this->pseudocost).inferencesdown.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).inferencesdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_358.prevboundval_.
         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_start)->first;
  (this->pseudocost).inferencesdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_358.prevboundval_.
         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_finish)->first;
  (this->pseudocost).inferencesdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_358.prevboundval_.
         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage)->first;
  local_358.prevboundval_.
  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.prevboundval_.
  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.prevboundval_.
  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4);
  }
  piVar5 = (this->pseudocost).ninferencesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).ninferencesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_358.activitymin_.
                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->pseudocost).ninferencesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_358.activitymin_.
                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (this->pseudocost).ninferencesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_358.activitymin_.
                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_358.activitymin_.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.activitymin_.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.activitymin_.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  piVar5 = (this->pseudocost).ninferencesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).ninferencesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_358.activitymax_.
                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->pseudocost).ninferencesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_358.activitymax_.
                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (this->pseudocost).ninferencesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_358.activitymax_.
                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_358.activitymax_.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.activitymax_.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.activitymax_.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  piVar5 = (this->pseudocost).ncutoffsup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).ncutoffsup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_358.activitymininf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->pseudocost).ncutoffsup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_358.activitymininf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->pseudocost).ncutoffsup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_358.activitymininf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_358.activitymininf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.activitymininf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.activitymininf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  piVar5 = (this->pseudocost).ncutoffsdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).ncutoffsdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_358.activitymaxinf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->pseudocost).ncutoffsdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_358.activitymaxinf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->pseudocost).ncutoffsdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_358.activitymaxinf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_358.activitymaxinf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.activitymaxinf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.activitymaxinf_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  pdVar4 = (this->pseudocost).conflictscoreup.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).conflictscoreup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_358.capacityThreshold_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->pseudocost).conflictscoreup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_358.capacityThreshold_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->pseudocost).conflictscoreup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_358.capacityThreshold_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_358.capacityThreshold_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.capacityThreshold_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.capacityThreshold_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4);
  }
  pdVar4 = (this->pseudocost).conflictscoredown.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).conflictscoredown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_358.propagateflags_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->pseudocost).conflictscoredown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_358.propagateflags_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (this->pseudocost).conflictscoredown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_358.propagateflags_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_358.propagateflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.propagateflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.propagateflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4);
  }
  pvVar10 = &local_358.propagateinds_;
  pdVar11 = &(this->pseudocost).conflict_weight;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    *pdVar11 = (double)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
    pvVar10 = (vector<int,_std::allocator<int>_> *)((long)pvVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    pdVar11 = pdVar11 + (ulong)bVar13 * -2 + 1;
  }
  HighsPseudocost::~HighsPseudocost((HighsPseudocost *)&local_358);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->maxAbsRowCoef,(long)this->mipsolver->model_->num_row_);
  mipsolver = this->mipsolver;
  uVar8 = (ulong)(uint)mipsolver->model_->num_row_;
  if (uVar8 != 0) {
    piVar5 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->maxAbsRowCoef).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      iVar1 = piVar5[uVar12];
      iVar2 = piVar5[uVar12 + 1];
      dVar14 = 0.0;
      if (iVar2 != iVar1) {
        dVar14 = 0.0;
        lVar9 = 0;
        do {
          dVar7 = ABS(pdVar4[iVar1 + lVar9]);
          if (dVar7 <= dVar14) {
            dVar7 = dVar14;
          }
          dVar14 = dVar7;
          lVar9 = lVar9 + 1;
        } while (iVar2 - iVar1 != (int)lVar9);
      }
      pdVar6[uVar12] = dVar14;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar8);
  }
  HighsDomain::HighsDomain(&local_358,mipsolver);
  HighsDomain::operator=(&this->domain,&local_358);
  HighsDomain::~HighsDomain(&local_358);
  HighsDomain::computeRowActivities(&this->domain);
  return;
}

Assistant:

void HighsMipSolverData::setupDomainPropagation() {
  const HighsLp& model = *mipsolver.model_;
  highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                       model.a_matrix_.index_, model.a_matrix_.value_, ARstart_,
                       ARindex_, ARvalue_);

  pseudocost = HighsPseudocost(mipsolver);

  // compute the maximal absolute coefficients to filter propagation
  maxAbsRowCoef.resize(mipsolver.model_->num_row_);
  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double maxabsval = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];
    for (HighsInt j = start; j != end; ++j)
      maxabsval = std::max(maxabsval, std::abs(ARvalue_[j]));

    maxAbsRowCoef[i] = maxabsval;
  }

  domain = HighsDomain(mipsolver);
  domain.computeRowActivities();
}